

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  stbrp_node *psVar5;
  undefined1 auVar6 [16];
  stbrp_context *psVar7;
  uint uVar8;
  int extraout_EAX;
  stbrp_node **ppsVar9;
  long extraout_RAX;
  long lVar10;
  int iVar11;
  int *piVar12;
  size_t sVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  stbrp_node *psVar15;
  uint uVar16;
  stbrp_context *psVar17;
  stbrp_node *in_R8;
  stbrp_node *psVar18;
  int iVar19;
  stbrp_node **ppsVar20;
  stbrp_context *c;
  ulong uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int waste;
  uint local_94;
  uint local_90;
  int local_8c;
  stbrp_node **local_88;
  int local_70;
  int local_6c;
  undefined8 local_68;
  stbrp_node **local_60;
  ulong local_58;
  stbrp_rect *local_50;
  stbrp_rect *local_48;
  size_t local_40;
  ulong local_38;
  
  auVar6 = _DAT_00194020;
  if (num_rects < 1) {
    uVar21 = (ulong)num_rects;
    qsort(rects,uVar21,0x10,rect_height_compare);
  }
  else {
    uVar21 = (ulong)(uint)num_rects;
    lVar10 = uVar21 - 1;
    auVar23._8_4_ = (int)lVar10;
    auVar23._0_8_ = lVar10;
    auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
    piVar12 = &rects[1].was_packed;
    uVar14 = 0;
    auVar23 = auVar23 ^ _DAT_00194020;
    auVar24 = _DAT_001940b0;
    do {
      auVar25 = auVar24 ^ auVar6;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        piVar12[-4] = (int)uVar14;
      }
      if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
          auVar25._12_4_ <= auVar23._12_4_) {
        *piVar12 = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar10 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar10 + 2;
      piVar12 = piVar12 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar14);
    local_68 = CONCAT44(in_register_00000014,num_rects);
    qsort(rects,uVar21,0x10,rect_height_compare);
    if (0 < (int)local_68) {
      local_60 = &context->active_head;
      sVar13 = 0;
      local_58 = uVar21;
      local_50 = rects;
      do {
        psVar1 = rects + sVar13;
        uVar2 = rects[sVar13].w;
        if ((uVar2 == 0) || (uVar3 = psVar1->h, uVar3 == 0)) {
          psVar1->x = 0;
          psVar1->y = 0;
        }
        else {
          iVar19 = context->width;
          iVar22 = (uint)uVar2 + context->align + -1;
          iVar22 = iVar22 - iVar22 % context->align;
          c = (stbrp_context *)context->active_head;
          uVar4 = (ushort)c->width;
          local_48 = psVar1;
          local_40 = sVar13;
          local_38 = (ulong)uVar2;
          if (iVar19 < (int)(iVar22 + (uint)uVar4)) {
            iVar11 = context->heuristic;
            local_88 = (stbrp_node **)0x0;
            local_8c = 0x40000000;
            local_94 = 0x40000000;
            local_90 = 0;
          }
          else {
            local_8c = 0x40000000;
            local_88 = (stbrp_node **)0x0;
            local_94 = 0x40000000;
            psVar17 = c;
            ppsVar20 = local_60;
            uVar2 = uVar4;
            do {
              uVar16 = stbrp__skyline_find_min_y
                                 (psVar17,(stbrp_node *)(ulong)uVar2,iVar22,(int)&local_6c,
                                  (int *)in_R8);
              iVar11 = context->heuristic;
              if (iVar11 == 0) {
                if ((int)uVar16 < (int)local_94) {
                  local_88 = ppsVar20;
                  local_94 = uVar16;
                }
              }
              else if (((int)(uVar3 + uVar16) <= context->height) &&
                      (((int)uVar16 < (int)local_94 || (local_6c < local_8c && uVar16 == local_94)))
                      ) {
                local_8c = local_6c;
                local_88 = ppsVar20;
                local_94 = uVar16;
              }
              ppsVar20 = (stbrp_node **)&psVar17->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar17->align)->width;
              psVar17 = *(stbrp_context **)&psVar17->align;
            } while ((int)(iVar22 + (uint)uVar2) <= iVar19);
            if (local_88 == (stbrp_node **)0x0) {
              local_88 = (stbrp_node **)0x0;
              local_90 = 0;
            }
            else {
              local_90 = (uint)(*local_88)->x;
            }
          }
          psVar17 = c;
          if (iVar11 == 1) {
            while (ppsVar20 = local_60, (int)(uint)uVar4 < iVar22) {
              uVar4 = (ushort)(*(stbrp_context **)&psVar17->align)->width;
              psVar17 = *(stbrp_context **)&psVar17->align;
            }
            do {
              uVar16 = (uint)(ushort)psVar17->width - iVar22;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar9 = ppsVar20;
                ppsVar20 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar16);
              uVar8 = stbrp__skyline_find_min_y
                                (c,(stbrp_node *)(ulong)uVar16,iVar22,(int)&local_70,(int *)in_R8);
              if ((((int)(uVar3 + uVar8) < context->height) && ((int)uVar8 <= (int)local_94)) &&
                 (((uVar8 < local_94 || (local_70 < local_8c)) ||
                  ((local_70 == local_8c && ((int)uVar16 < (int)local_90)))))) {
                local_8c = local_70;
                local_90 = uVar16;
                local_88 = ppsVar9;
                local_94 = uVar8;
              }
              psVar17 = *(stbrp_context **)&psVar17->align;
              ppsVar20 = ppsVar9;
            } while (psVar17 != (stbrp_context *)0x0);
          }
          sVar13 = local_40;
          rects = local_50;
          uVar21 = local_58;
          if (((local_88 == (stbrp_node **)0x0) || (context->height < (int)(uVar3 + local_94))) ||
             (psVar5 = context->free_head, psVar5 == (stbrp_node *)0x0)) {
            local_48->x = 0xffff;
            local_48->y = 0xffff;
          }
          else {
            psVar5->x = (stbrp_coord)local_90;
            psVar5->y = (stbrp_coord)(uVar3 + local_94);
            context->free_head = psVar5->next;
            psVar18 = *local_88;
            psVar15 = psVar18;
            if ((int)(uint)psVar18->x < (int)local_90) {
              psVar15 = psVar18->next;
              local_88 = &psVar18->next;
            }
            *local_88 = psVar5;
            in_R8 = psVar15->next;
            iVar19 = local_90 + (int)local_38;
            if (in_R8 != (stbrp_node *)0x0) {
              do {
                psVar18 = in_R8;
                in_R8 = (stbrp_node *)(ulong)psVar18->x;
                if (iVar19 < (int)(uint)psVar18->x) goto LAB_0013db25;
                psVar15->next = context->free_head;
                context->free_head = psVar15;
                psVar15 = psVar18;
                in_R8 = psVar18->next;
              } while (psVar18->next != (stbrp_node *)0x0);
              in_R8 = (stbrp_node *)0x0;
            }
LAB_0013db25:
            psVar5->next = psVar15;
            if ((int)(uint)psVar15->x < iVar19) {
              psVar15->x = (stbrp_coord)iVar19;
            }
            local_48->x = (stbrp_coord)local_90;
            local_48->y = (stbrp_coord)local_94;
          }
        }
        sVar13 = sVar13 + 1;
        if (sVar13 == uVar21) {
          qsort(rects,uVar21,0x10,rect_original_order);
          lVar10 = extraout_RAX;
          if (0 < (int)local_68) {
            lVar10 = 0;
            do {
              uVar16 = 1;
              if (*(short *)((long)&rects->x + lVar10) == -1) {
                uVar16 = (uint)(*(short *)((long)&rects->y + lVar10) != -1);
              }
              *(uint *)((long)&rects->was_packed + lVar10) = uVar16;
              lVar10 = lVar10 + 0x10;
            } while (uVar21 * 0x10 != lVar10);
          }
          return (int)lVar10;
        }
      } while( true );
    }
  }
  qsort(rects,uVar21,0x10,rect_original_order);
  return extraout_EAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}